

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_pause(http_s *h,_func_void_http_pause_handle_s_ptr *task)

{
  _func_int_http_s_ptr_FIOBJ_FIOBJ *local_58;
  _func_void_http_pause_handle_s_ptr *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  void *local_30;
  http_pause_handle_s *http;
  http_vtable_s *vtbl;
  http_fio_protocol_s *p;
  _func_void_http_pause_handle_s_ptr *task_local;
  http_s *h_local;
  
  if ((h != (http_s *)0x0) && (((h->method != 0 || (h->status_str != 0)) || (h->status == 0)))) {
    vtbl = (http_vtable_s *)(h->private_data).flag;
    http = (http_pause_handle_s *)(h->private_data).vtbl;
    p = (http_fio_protocol_s *)task;
    task_local = (_func_void_http_pause_handle_s_ptr *)h;
    local_30 = fio_malloc(0x28);
    local_58 = vtbl->http_push_file;
    local_50 = task_local;
    local_48 = *(undefined8 *)(task_local + 0x78);
    local_40 = 0;
    local_38 = 0;
    memcpy(local_30,&local_58,0x28);
    (*(code *)http[1].udata)(task_local,vtbl);
    fio_defer(http_pause_wrapper,local_30,p);
  }
  return;
}

Assistant:

void http_pause(http_s *h, void (*task)(http_pause_handle_s *http)) {
  if (HTTP_INVALID_HANDLE(h)) {
    return;
  }
  http_fio_protocol_s *p = (http_fio_protocol_s *)h->private_data.flag;
  http_vtable_s *vtbl = (http_vtable_s *)h->private_data.vtbl;
  http_pause_handle_s *http = fio_malloc(sizeof(*http));
  *http = (http_pause_handle_s){
      .uuid = p->uuid,
      .h = h,
      .udata = h->udata,
  };
  vtbl->http_on_pause(h, p);
  fio_defer(http_pause_wrapper, http, (void *)((uintptr_t)task));
}